

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  string *str;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar2;
  char *s;
  size_t s_length;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  string_view text_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  string_view local_e8;
  undefined1 auStack_d8 [8];
  Token token;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string *local_20;
  string *text_local;
  WastParser *this_local;
  
  local_20 = text;
  text_local = (string *)this;
  bVar1 = PeekMatch(this,Text);
  if (bVar1) {
    Consume((Token *)auStack_d8,this);
    str = Token::text_abi_cxx11_((Token *)auStack_d8);
    string_view::string_view(&local_e8,str);
    bVar2 = std::back_inserter<std::__cxx11::string>(local_20);
    text_00.size_ = (size_type)bVar2.container;
    text_00.data_ = (char *)local_e8.size_;
    (anonymous_namespace)::RemoveEscapes<std::back_insert_iterator<std::__cxx11::string>>
              ((_anonymous_namespace_ *)local_e8.data_,text_00,in_RCX);
    s = (char *)std::__cxx11::string::data((string *)local_20);
    s_length = std::__cxx11::string::length((string *)local_20);
    bVar1 = IsValidUtf8(s,s_length);
    if (!bVar1) {
      Error(this,0x19b4e22);
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
    Token::~Token((Token *)auStack_d8);
  }
  else {
    token.field_2._35_1_ = 1;
    local_70 = &local_68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"a quoted string",&local_71);
    token.field_2._35_1_ = 0;
    local_48 = &local_68;
    local_40 = 1;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(token.field_2.literal_.text.field_2._M_local_buf + 10);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,this_00);
    this_local._4_4_ = ErrorExpected(this,&local_38,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(token.field_2.literal_.text.field_2._M_local_buf + 10));
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_148 = local_148 + -1;
      std::__cxx11::string::~string((string *)local_148);
    } while (local_148 != &local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}